

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void testTinySVD_4x4<float>(Matrix44<float> *A)

{
  bool bVar1;
  ostream *poVar2;
  float (*pafVar3) [4];
  int i;
  long lVar4;
  int j;
  long lVar5;
  int cols [4];
  Matrix44<float> B;
  int local_78 [4];
  float local_68;
  float local_64 [15];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Verifying SVD for [[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[0][0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[0][1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[0][2]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[0][3]);
  poVar2 = std::operator<<(poVar2,"], ");
  poVar2 = std::operator<<(poVar2,"[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[1][0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[1][1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[1][2]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[1][3]);
  poVar2 = std::operator<<(poVar2,"], ");
  poVar2 = std::operator<<(poVar2,"[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[2][0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[2][1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[2][2]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[2][3]);
  poVar2 = std::operator<<(poVar2,"], ");
  poVar2 = std::operator<<(poVar2,"[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[3][0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[3][1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[3][2]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[3][3]);
  std::operator<<(poVar2,"]]\n");
  verifyTinySVD_4x4<float>(A);
  Imath_2_5::Matrix44<float>::transposed(A);
  verifyTinySVD_4x4<float>((Matrix44<float> *)&local_68);
  local_78[0] = 0;
  local_78[1] = 1;
  local_78[2] = 2;
  local_78[3] = 3;
  do {
    local_64[10] = 0.0;
    local_64[0xb] = 0.0;
    local_64[0xc] = 0.0;
    local_64[0xd] = 0.0;
    local_64[6] = 0.0;
    local_64[7] = 0.0;
    local_64[0] = 0.0;
    local_64[1] = 0.0;
    local_64[2] = 0.0;
    local_64[3] = 0.0;
    local_68 = 1.0;
    local_64[4] = 1.0;
    local_64[5] = 0.0;
    local_64[8] = 0.0;
    local_64[9] = 1.0;
    local_64[0xe] = 1.0;
    pafVar3 = (float (*) [4])&local_68;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        (*(float (*) [4])*pafVar3)[lVar5] = A->x[lVar4][local_78[lVar5]];
      }
      pafVar3 = pafVar3 + 1;
    }
    verifyTinySVD_4x4<float>((Matrix44<float> *)&local_68);
    bVar1 = std::__next_permutation<int*,__gnu_cxx::__ops::_Iter_less_iter>(local_78);
  } while (bVar1);
  return;
}

Assistant:

void
testTinySVD_4x4 (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    std::cout << "Verifying SVD for [[" << A[0][0] << ", " << A[0][1] << ", " << A[0][2] << ", " << A[0][3] << "], "
                                 << "[" << A[1][0] << ", " << A[1][1] << ", " << A[1][2] << ", " << A[1][3] << "], "
                                 << "[" << A[2][0] << ", " << A[2][1] << ", " << A[2][2] << ", " << A[2][3] << "], "
                                 << "[" << A[3][0] << ", " << A[3][1] << ", " << A[3][2] << ", " << A[3][3] << "]]\n";
 
    verifyTinySVD_4x4 (A);
    verifyTinySVD_4x4 (A.transposed());

    // Try all different orderings of the columns of A:
    int cols[4] = { 0, 1, 2, 3 };
    do
    {
        IMATH_INTERNAL_NAMESPACE::Matrix44<T> B;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                B[i][j] = A[i][cols[j]];

        verifyTinySVD_4x4 (B);
    } while (std::next_permutation (cols, cols + 4));
}